

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O3

int __thiscall
NNTreeImpl::binarySearch
          (NNTreeImpl *this,QPDFObjectHandle *key,QPDFObjectHandle *items,int num_items,
          bool return_prev_if_not_found,offset_in_NNTreeImpl_to_subr compare)

{
  long *plVar1;
  int iVar2;
  code *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  code *in_stack_00000008;
  long in_stack_00000010;
  
  uVar5 = 1;
  do {
    uVar4 = uVar5;
    uVar5 = uVar4 * 2;
  } while ((int)uVar4 < num_items);
  if ((int)uVar4 < 1) {
    bVar9 = false;
    uVar5 = 0xffffffff;
    bVar8 = false;
  }
  else {
    uVar7 = uVar4 >> 1;
    plVar1 = (long *)((long)&this->details + in_stack_00000010);
    uVar5 = 0xffffffff;
    bVar8 = false;
    uVar6 = uVar7;
    do {
      if ((int)uVar7 < num_items) {
        pcVar3 = in_stack_00000008;
        if (((ulong)in_stack_00000008 & 1) != 0) {
          pcVar3 = *(code **)(in_stack_00000008 + *plVar1 + -1);
        }
        iVar2 = (*pcVar3)(plVar1,key,items,uVar7);
        bVar8 = (bool)(bVar8 | -1 < iVar2);
        if (-1 < iVar2) {
          uVar5 = uVar7;
        }
        if (iVar2 == 0) {
          bVar9 = true;
          goto LAB_0012deb0;
        }
        if (1 < uVar4) {
          bVar9 = uVar6 < 2;
          uVar6 = (int)uVar6 >> 1;
          if (bVar9) {
            uVar6 = 1;
          }
          if (iVar2 < 0) goto LAB_0012de86;
          uVar7 = uVar7 + uVar6;
        }
      }
      else if (1 < uVar4) {
        bVar9 = uVar6 < 2;
        uVar6 = (int)uVar6 >> 1;
        if (bVar9) {
          uVar6 = 1;
        }
LAB_0012de86:
        uVar7 = uVar7 - uVar6;
      }
      uVar4 = uVar4 >> 1;
    } while (uVar4 != 0);
    bVar9 = false;
  }
LAB_0012deb0:
  uVar4 = 0xffffffff;
  if (return_prev_if_not_found) {
    uVar4 = uVar5;
  }
  if (!bVar8) {
    uVar4 = 0xffffffff;
  }
  if (bVar9) {
    uVar4 = uVar5;
  }
  return uVar4;
}

Assistant:

int
NNTreeImpl::binarySearch(
    QPDFObjectHandle key,
    QPDFObjectHandle items,
    int num_items,
    bool return_prev_if_not_found,
    int (NNTreeImpl::*compare)(QPDFObjectHandle& key, QPDFObjectHandle& arr, int item))
{
    int max_idx = 1;
    while (max_idx < num_items) {
        max_idx <<= 1;
    }

    int step = max_idx / 2;
    int checks = max_idx;
    int idx = step;
    int found_idx = -1;
    bool found = false;
    bool found_leq = false;
    int status = 0;

    while ((!found) && (checks > 0)) {
        if (idx < num_items) {
            status = (this->*compare)(key, items, idx);
            if (status >= 0) {
                found_leq = true;
                found_idx = idx;
            }
        } else {
            // consider item to be below anything after the top
            status = -1;
        }

        if (status == 0) {
            found = true;
        } else {
            checks >>= 1;
            if (checks > 0) {
                step >>= 1;
                if (step == 0) {
                    step = 1;
                }

                if (status < 0) {
                    idx -= step;
                } else {
                    idx += step;
                }
            }
        }
    }

    if (found || (found_leq && return_prev_if_not_found)) {
        return found_idx;
    } else {
        return -1;
    }
}